

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O0

double rotationMatrixFromContactsPositionKine(Vector3 *vLFootPos,Vector3 *vRFootPos,Matrix3 *R)

{
  Matrix<double,3,1,0,3,1> *this;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *this_00;
  Scalar *pSVar1;
  Vector3 *other;
  Scalar *pSVar2;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar3;
  double dVar4;
  double local_158;
  double local_150;
  double local_148;
  Scalar local_140;
  double local_138;
  double local_130;
  double local_128 [3];
  double local_110;
  double local_108;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_100;
  AngleAxis local_e0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_c0;
  double local_a8;
  double thetaz;
  double thetay;
  double thetax;
  double h;
  AngleAxis j;
  Vector3 theta;
  Vector3 axis;
  Vector3 Vrl;
  Matrix3 *R_local;
  Vector3 *vRFootPos_local;
  Vector3 *vLFootPos_local;
  
  this = (Matrix<double,3,1,0,3,1> *)
         (axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
         2);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)this);
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
            (theta.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array + 2);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)this_00);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)&j.m_angle);
  Eigen::AngleAxis<double>::AngleAxis((AngleAxis<double> *)&h);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_c0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)vLFootPos,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)vRFootPos);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            (this,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)&local_c0);
  stateObservation::kine::rotationVectorToAngleAxis(&local_e0,(Vector3 *)this);
  Eigen::AngleAxis<double>::operator=((AngleAxis<double> *)&h,&local_e0);
  pSVar1 = Eigen::AngleAxis<double>::angle((AngleAxis<double> *)&h);
  thetax = *pSVar1;
  other = Eigen::AngleAxis<double>::axis((AngleAxis<double> *)&h);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=((Matrix<double,_3,_1,_0,_3,_1> *)this_00,other);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](this_00,1);
  dVar4 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](this_00,2);
  thetay = atan2(dVar4,*pSVar2);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](this_00,0);
  dVar4 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](this_00,2);
  thetaz = atan2(dVar4,*pSVar2);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](this_00,0);
  dVar4 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](this_00,1);
  local_a8 = atan2(dVar4,*pSVar2);
  dVar4 = cos(thetaz);
  local_108 = cos(local_a8);
  local_108 = dVar4 * local_108;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
            (&local_100,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)R,&local_108);
  dVar4 = cos(thetaz);
  local_110 = sin(local_a8);
  local_110 = -dVar4 * local_110;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_100,&local_110);
  local_128[0] = sin(thetaz);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,local_128);
  local_130 = sin(local_a8);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_130);
  local_138 = cos(local_a8);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_138);
  local_140 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_140);
  dVar4 = sin(thetaz);
  local_148 = cos(local_a8);
  local_148 = -dVar4 * local_148;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_148);
  dVar4 = sin(thetaz);
  local_150 = sin(local_a8);
  local_150 = dVar4 * local_150;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_150);
  local_158 = cos(thetaz);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&local_158);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_100);
  return thetax;
}

Assistant:

double rotationMatrixFromContactsPositionKine(const Vector3 vLFootPos, const Vector3 vRFootPos, Matrix3& R )
{
Vector3 Vrl, axis, theta;
AngleAxis j;
double h, thetax, thetay, thetaz;
// Definition of the length and the unit vector between the two foots.
Vrl=vLFootPos-vRFootPos;
j=kine::rotationVectorToAngleAxis(Vrl);
h = j.angle(); // length between the ankles
axis = j.axis(); // unit vector between the ankles
//Definition of the transformation (rotation) between (x,y,z) and (perpendicular of j, j, z).
thetax=atan2(axis[1],axis[2]);
//theta=theta(0,0,atan(axis[0]/axis[1]));
thetay = atan2(axis[0],axis[2]);//theta[1];
thetaz = atan2(axis[0],axis[1]);//theta[2];
R << cos(thetay)*cos(thetaz), -cos(thetay)*sin(thetaz), sin(thetay),
sin(thetaz), cos(thetaz), 0,
-sin(thetay)*cos(thetaz), sin(thetay)*sin(thetaz), cos(thetay);
return h;
}